

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

void despot::DESPOT::Expand
               (VNode *vnode,ScenarioLowerBound *lower_bound,ScenarioUpperBound *upper_bound,
               DSPOMDP *model,RandomStreams *streams,History *history)

{
  int iVar1;
  int iVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  void *pvVar5;
  QNode *this;
  QNode *local_50;
  QNode *qnode;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvStack_40;
  ACT_TYPE action;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *children;
  History *history_local;
  RandomStreams *streams_local;
  DSPOMDP *model_local;
  ScenarioUpperBound *upper_bound_local;
  ScenarioLowerBound *lower_bound_local;
  VNode *vnode_local;
  
  children = (vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *)history;
  history_local = (History *)streams;
  streams_local = (RandomStreams *)model;
  model_local = (DSPOMDP *)upper_bound;
  upper_bound_local = (ScenarioUpperBound *)lower_bound;
  lower_bound_local = (ScenarioLowerBound *)vnode;
  pvStack_40 = VNode::children(vnode);
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar3 = logging::stream(4);
    poVar4 = std::operator<<(&plVar3->super_ostream,"- Expanding vnode ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,lower_bound_local);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  for (qnode._4_4_ = 0; iVar1 = qnode._4_4_,
      iVar2 = (*(code *)*(pointer *)
                         ((long)&(streams_local->streams_).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10)
              )(), iVar1 < iVar2; qnode._4_4_ = qnode._4_4_ + 1) {
    iVar1 = logging::level();
    if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
      plVar3 = logging::stream(4);
      poVar4 = std::operator<<(&plVar3->super_ostream," Action ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,qnode._4_4_);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    this = (QNode *)operator_new(0x88);
    QNode::QNode(this,(VNode *)lower_bound_local,qnode._4_4_);
    local_50 = this;
    std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::push_back(pvStack_40,&local_50);
    Expand(local_50,(ScenarioLowerBound *)upper_bound_local,(ScenarioUpperBound *)model_local,
           (DSPOMDP *)streams_local,(RandomStreams *)history_local,(History *)children);
  }
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar3 = logging::stream(4);
    poVar4 = std::operator<<(&plVar3->super_ostream,"* Expansion complete!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void DESPOT::Expand(VNode* vnode,
	ScenarioLowerBound* lower_bound, ScenarioUpperBound* upper_bound,
	const DSPOMDP* model, RandomStreams& streams,
	History& history) {
	vector<QNode*>& children = vnode->children();
	logd << "- Expanding vnode " << vnode << endl;
	for (ACT_TYPE action = 0; action < model->NumActions(); action++) {
		logd << " Action " << action << endl;
		QNode* qnode = new QNode(vnode, action);
		children.push_back(qnode);

		Expand(qnode, lower_bound, upper_bound, model, streams, history);
	}
	logd << "* Expansion complete!" << endl;
}